

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

void tree_sitter_haskell_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  uint32_t uVar1;
  undefined8 uStack_5c;
  uint contexts_size;
  undefined1 local_54 [20];
  Persist *persist;
  undefined4 uStack_38;
  Persist p;
  State *state;
  uint length_local;
  char *buffer_local;
  void *payload_local;
  
  local_54._12_8_ = buffer;
  p.newline._8_8_ = payload;
  if (length == 0) {
    memset(&stack0xffffffffffffffa4,0,0x14);
    stack0xffffffffffffffc4 = uStack_5c;
    p.contexts = local_54._0_4_;
    p.newline.state = local_54._4_4_;
    p.newline.end = local_54._8_4_;
    local_54._12_8_ = (long)&persist + 4;
    uStack_38 = 3;
  }
  uVar1 = *(uint32_t *)local_54._12_8_;
  *(undefined8 *)(p.newline._8_8_ + 0x10) = *(undefined8 *)(local_54._12_8_ + 4);
  *(undefined8 *)(p.newline._8_8_ + 0x18) = *(undefined8 *)(local_54._12_8_ + 0xc);
  _array__reserve((Array *)p.newline._8_8_,8,*(uint32_t *)local_54._12_8_);
  *(uint32_t *)(p.newline._8_8_ + 8) = *(uint32_t *)local_54._12_8_;
  if (length != 0) {
    memcpy(*(void **)p.newline._8_8_,buffer + 0x14,(ulong)(uVar1 << 3));
  }
  *(undefined4 *)(p.newline._8_8_ + 0x28) = 0;
  *(undefined4 *)(p.newline._8_8_ + 0x30) = 0;
  _array__reserve((Array *)(p.newline._8_8_ + 0x20),4,8);
  return;
}

Assistant:

void tree_sitter_haskell_external_scanner_deserialize(void *payload, const char *buffer, unsigned length) {
  State *state = (State *) payload;
  Persist p;
  Persist *persist;
  if (length > 0)
    persist = (Persist *) buffer;
  else {
    p = (Persist) {.contexts = 0};
    persist = &p;
    persist->newline.state = NResume;
  }
  unsigned contexts_size = persist->contexts * sizeof(Context);
  state->newline = persist->newline;
  array_reserve(&state->contexts, persist->contexts);
  state->contexts.size = persist->contexts;
  if (length > 0)
    memcpy(state->contexts.contents, buffer + sizeof(Persist), contexts_size);
  state->lookahead.size = 0;
  state->lookahead.offset = 0;
  array_reserve(&state->lookahead, 8);
#ifdef TREE_SITTER_DEBUG
  if (length > 0)
    deserialize_parse_lines(buffer + sizeof(Persist) + contexts_size, &state->parse, persist->parse);
#endif
}